

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::cpp_unittest::MovableMessageTest_MoveConstructor_Test::TestBody
          (MovableMessageTest_MoveConstructor_Test *this)

{
  char *pcVar1;
  TestAllTypes_NestedMessage *nested;
  TestAllTypes message1;
  TestAllTypes message2;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_6b0;
  AssertHelper local_6a8;
  internal local_6a0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_698;
  TestAllTypes_NestedMessage *local_690;
  TestAllTypes local_688;
  TestAllTypes local_348;
  
  proto2_unittest::TestAllTypes::TestAllTypes(&local_688,(Arena *)0x0);
  TestUtil::SetAllFields<proto2_unittest::TestAllTypes>(&local_688);
  local_690 = local_688.field_0._impl_.optional_nested_message_;
  if (local_688.field_0._impl_.optional_nested_message_ == (TestAllTypes_NestedMessage *)0x0) {
    local_690 = (TestAllTypes_NestedMessage *)
                &proto2_unittest::_TestAllTypes_NestedMessage_default_instance_;
  }
  proto2_unittest::TestAllTypes::TestAllTypes(&local_348,(Arena *)0x0,&local_688);
  TestUtil::ExpectAllFieldsSet<proto2_unittest::TestAllTypes>(&local_348);
  if (local_348.field_0._impl_.optional_nested_message_ == (TestAllTypes_NestedMessage *)0x0) {
    local_348.field_0._impl_.optional_nested_message_ =
         (TestAllTypes_NestedMessage *)
         &proto2_unittest::_TestAllTypes_NestedMessage_default_instance_;
  }
  local_6b0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       local_348.field_0._impl_.optional_nested_message_;
  testing::internal::
  CmpHelperEQ<proto2_unittest::TestAllTypes_NestedMessage_const*,proto2_unittest::TestAllTypes_NestedMessage_const*>
            (local_6a0,"nested","&message2.optional_nested_message()",&local_690,
             (TestAllTypes_NestedMessage **)&local_6b0);
  if (local_6a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_6b0);
    if (local_698 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar1 = (local_698->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_6a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/move_unittest.cc"
               ,0x27,pcVar1);
    testing::internal::AssertHelper::operator=(&local_6a8,(Message *)&local_6b0);
    testing::internal::AssertHelper::~AssertHelper(&local_6a8);
    if ((TestAllTypes_NestedMessage *)local_6b0._M_head_impl != (TestAllTypes_NestedMessage *)0x0) {
      (**(code **)(*(long *)local_6b0._M_head_impl + 8))();
    }
  }
  if (local_698 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_698,local_698);
  }
  if (local_688.field_0._impl_.optional_nested_message_ == (TestAllTypes_NestedMessage *)0x0) {
    local_688.field_0._impl_.optional_nested_message_ =
         (TestAllTypes_NestedMessage *)
         &proto2_unittest::_TestAllTypes_NestedMessage_default_instance_;
  }
  local_6b0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       local_688.field_0._impl_.optional_nested_message_;
  testing::internal::
  CmpHelperNE<proto2_unittest::TestAllTypes_NestedMessage_const*,proto2_unittest::TestAllTypes_NestedMessage_const*>
            (local_6a0,"nested","&message1.optional_nested_message()",&local_690,
             (TestAllTypes_NestedMessage **)&local_6b0);
  if (local_6a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_6b0);
    if (local_698 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar1 = (local_698->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_6a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/move_unittest.cc"
               ,0x28,pcVar1);
    testing::internal::AssertHelper::operator=(&local_6a8,(Message *)&local_6b0);
    testing::internal::AssertHelper::~AssertHelper(&local_6a8);
    if ((TestAllTypes_NestedMessage *)local_6b0._M_head_impl != (TestAllTypes_NestedMessage *)0x0) {
      (**(code **)(*(long *)local_6b0._M_head_impl + 8))();
    }
  }
  if (local_698 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_698,local_698);
  }
  proto2_unittest::TestAllTypes::~TestAllTypes(&local_348);
  proto2_unittest::TestAllTypes::~TestAllTypes(&local_688);
  return;
}

Assistant:

TEST(MovableMessageTest, MoveConstructor) {
  proto2_unittest::TestAllTypes message1;
  TestUtil::SetAllFields(&message1);
  const auto* nested = &message1.optional_nested_message();

  proto2_unittest::TestAllTypes message2(std::move(message1));
  TestUtil::ExpectAllFieldsSet(message2);

  // Check if the optional_nested_message was actually moved (and not just
  // copied).
  EXPECT_EQ(nested, &message2.optional_nested_message());
  EXPECT_NE(nested, &message1.optional_nested_message());
}